

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O0

int testCharRangeByte3(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlChar *pxVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int value;
  char *data;
  uchar uStack_30;
  uchar uStack_2f;
  uchar lows [6];
  int c;
  int len;
  int K;
  int k;
  int j;
  int i;
  xmlParserCtxtPtr ctxt_local;
  
  data._2_4_ = 0xc1818000;
  data._6_2_ = 0xbfff;
  pxVar2 = ctxt->input->cur;
  pxVar2[3] = '\0';
  k = 0xe0;
  do {
    if (0xff < k) {
      return 0;
    }
    for (K = 0; K < 0x100; K = K + 1) {
      for (len = 0; len < 6; len = len + 1) {
        *pxVar2 = (xmlChar)k;
        pxVar2[1] = (xmlChar)K;
        bVar1 = *(byte *)((long)&data + (long)len + 2);
        uVar3 = (uint)bVar1;
        pxVar2[2] = bVar1;
        uVar4 = (uVar3 & 0x3f) + (K & 0x3fU) * 0x40 + (k & 0xfU) * 0x1000;
        ctxt->nbErrors = 0;
        uVar5 = testCurrentChar(ctxt,(int *)(lows + 2));
        uStack_30 = (char)uVar5;
        uStack_2f = (char)(uVar5 >> 8);
        lows[0] = (char)(uVar5 >> 0x10);
        lows[1] = (char)(uVar5 >> 0x18);
        if (-1 < (int)uVar5) {
          if ((k & 0xf0U) == 0xf0) {
            if (lastError != 0x51) {
              fprintf(_stderr,
                      "Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x%02X 0x%02X\n",
                      (ulong)(uint)k,(ulong)(uint)K,(ulong)uVar3,(ulong)(uint)(int)(char)pxVar2[3]);
              return 1;
            }
          }
          else if (((K & 0xc0U) == 0x80) && ((uVar3 & 0xc0) == 0x80)) {
            if (((k & 0xfU) == 0) && ((K & 0x20U) == 0)) {
              if (lastError != 0x51) {
                fprintf(_stderr,"Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x%02X\n",
                        (ulong)(uint)k,(ulong)(uint)K,(ulong)uVar3);
                return 1;
              }
            }
            else if ((uVar4 < 0xd800) || (0xdfff < uVar4)) {
              if ((lastError != 0) || (lows._2_4_ != 3)) {
                fprintf(_stderr,"Failed to parse char for Bytes 0x%02X 0x%02X 0x%02X\n",
                        (ulong)(uint)k,(ulong)(uint)K,(ulong)uVar3);
                return 1;
              }
              if (uVar5 != uVar4) {
                fprintf(_stderr,
                        "Failed to parse char for Bytes 0x%02X 0x%02X 0x%02X: expect %d got %d\n",
                        (ulong)(uint)k,(ulong)(uint)K,(ulong)(uint)(int)(char)pxVar2[2],(ulong)uVar4
                        ,uVar5);
                return 1;
              }
            }
            else if (lastError != 0x51) {
              fprintf(_stderr,
                      "Failed to detect invalid char 0x%04X for Bytes 0x%02X 0x%02X 0x%02X\n",
                      (ulong)uVar4,(ulong)(uint)k,(ulong)(uint)K,(ulong)uVar3);
              return 1;
            }
          }
          else if (lastError != 0x51) {
            fprintf(_stderr,"Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x%02X\n",
                    (ulong)(uint)k,(ulong)(uint)K,(ulong)uVar3);
            return 1;
          }
        }
      }
    }
    k = k + 1;
  } while( true );
}

Assistant:

static int testCharRangeByte3(xmlParserCtxtPtr ctxt) {
    int i, j, k, K;
    int len, c;
    unsigned char lows[6] = {0, 0x80, 0x81, 0xC1, 0xFF, 0xBF};
    char *data = (char *) ctxt->input->cur;
    int value;

    data[3] = 0;
    for (i = 0xE0;i <= 0xFF;i++) {
    for (j = 0;j <= 0xFF;j++) {
    for (k = 0;k < 6;k++) {
	data[0] = (char) i;
	data[1] = (char) j;
	K = lows[k];
	data[2] = (char) K;
	value = (K & 0x3F) + ((j & 0x3F) << 6) + ((i & 0xF) << 12);
        ctxt->nbErrors = 0;

        c = testCurrentChar(ctxt, &len);
        if (c < 0)
            continue;

	/*
	 * if fourth bit of first char is set, then the sequence would need
	 * at least 4 bytes, but we give only 3 !
	 */
	if ((i & 0xF0) == 0xF0) {
	    if (lastError != XML_ERR_INVALID_ENCODING) {
		fprintf(stderr,
	"Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x%02X 0x%02X\n",
			i, j, K, data[3]);
		return(1);
	    }
	}

        /*
	 * The second and the third bytes must start with 10
	 */
	else if (((j & 0xC0) != 0x80) || ((K & 0xC0) != 0x80)) {
	    if (lastError != XML_ERR_INVALID_ENCODING) {
		fprintf(stderr,
	"Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x%02X\n",
			i, j, K);
		return(1);
	    }
	}

	/*
	 * if using a 3 byte encoding then the value must be greater
	 * than 0x800, i.e. one of bits 4 to 0 of i must be set or
	 * the 6th byte of data[1] must be set
	 */
	else if (((i & 0xF) == 0) && ((j & 0x20) == 0)) {
	    if (lastError != XML_ERR_INVALID_ENCODING) {
		fprintf(stderr,
	    "Failed to detect invalid char for Bytes 0x%02X 0x%02X 0x%02X\n",
			i, j, K);
		return(1);
	    }
	}

        /*
	 * There are values that are not allowed in UTF-8
	 */
	else if ((value > 0xD7FF) && (value <0xE000)) {
	    if (lastError != XML_ERR_INVALID_ENCODING) {
		fprintf(stderr,
	"Failed to detect invalid char 0x%04X for Bytes 0x%02X 0x%02X 0x%02X\n",
			value, i, j, K);
		return(1);
	    }
	}

	/*
	 * We should see no error in remaining cases
	 */
	else if ((lastError != 0) || (len != 3)) {
	    fprintf(stderr,
		"Failed to parse char for Bytes 0x%02X 0x%02X 0x%02X\n",
		    i, j, K);
	    return(1);
	}

	/*
	 * Finally check the value is right
	 */
	else if (c != value) {
	    fprintf(stderr,
    "Failed to parse char for Bytes 0x%02X 0x%02X 0x%02X: expect %d got %d\n",
		i, j, data[2], value, c);
	    return(1);
	}
    }
    }
    }
    return(0);
}